

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<33UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,12ul,1ul,6ul,1ul,10ul,1ul>
          (cx_string<33UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<12UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<6UL> *strings_4,cx_string<1UL> *strings_5,cx_string<10UL> *strings_6,
          cx_string<1UL> *strings_7)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  char buffer [34];
  ulong local_c8 [9];
  size_t size [9];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined2 local_8;
  
  puVar3 = &local_28;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_8 = 0;
  size[2] = (size_t)this;
  size[3] = (size_t)strings;
  size[4] = (size_t)strings_1;
  size[5] = (size_t)strings_2;
  size[6] = (size_t)strings_3;
  size[7] = (size_t)strings_4;
  size[8] = (size_t)strings_5;
  lVar1 = 1;
  local_c8[1] = 1;
  local_c8[2] = 1;
  local_c8[3] = 0xc;
  local_c8[4] = 1;
  local_c8[5] = 6;
  local_c8[6] = 1;
  local_c8[7] = 10;
  local_c8[8] = 1;
  do {
    if (local_c8[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)(size[lVar1 + 1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_c8[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  __return_storage_ptr__->_data[0x21] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_28;
  *(undefined8 *)(__return_storage_ptr__->_data + 8) = uStack_20;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x10) = local_18;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x18) = uStack_10;
  __return_storage_ptr__->_data[0x20] = (char)local_8;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}